

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O2

char * tcmalloc::DoWithWriterToStrDup
                 (ChunkedWriterConfig *config,_func_void_GenericWriter_ptr_void_ptr *body,void *arg)

{
  undefined8 *puVar1;
  char *pcVar2;
  undefined8 **ppuVar3;
  long lVar4;
  undefined8 *puVar5;
  size_t __n;
  undefined1 local_60 [8];
  ChunkedStorageWriter writer;
  undefined8 *local_30;
  
  writer.super_GenericWriter.buf_end_ = (char *)&writer.storage_;
  local_30 = (undefined8 *)0x0;
  writer.super_GenericWriter.buf_fill_ = (char *)0x0;
  writer.super_GenericWriter._vptr_GenericWriter = (_func_int **)0x0;
  writer.super_GenericWriter.buf_ = (char *)0x0;
  local_60 = (undefined1  [8])&PTR__ChunkedStorageWriter_0012cb90;
  writer.storage_ = (ChunkedStorage *)config;
  (*body)((GenericWriter *)local_60,arg);
  ppuVar3 = &local_30;
  anon_unknown_0::ChunkedStorageWriter::~ChunkedStorageWriter((ChunkedStorageWriter *)local_60);
  lVar4 = 0;
  while (ppuVar3 = (undefined8 **)*ppuVar3, ppuVar3 != (undefined8 **)0x0) {
    lVar4 = lVar4 + *(int *)((long)ppuVar3 + 0xc);
  }
  pcVar2 = (char *)tc_malloc(lVar4 + 1);
  pcVar2[lVar4] = '\0';
  puVar5 = local_30;
  while (puVar5 != (undefined8 *)0x0) {
    __n = (size_t)*(int *)((long)puVar5 + 0xc);
    memcpy(pcVar2 + (lVar4 - __n),puVar5 + 2,__n);
    lVar4 = lVar4 - __n;
    puVar1 = (undefined8 *)*puVar5;
    (*(code *)(writer.storage_)->last_chunk)(puVar5);
    puVar5 = puVar1;
  }
  return pcVar2;
}

Assistant:

char* DoWithWriterToStrDup(const ChunkedWriterConfig& config, void (*body)(GenericWriter* writer, void* arg), void* arg) {
  ChunkedStorage storage(config);
  {
    ChunkedStorageWriter writer{&storage};
    body(&writer, arg);
    // Ensure writer is destroyed and releases it's entire output
    // into storage.
  }
  return storage.StrDupAndRelease();
}